

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O3

int whisper_wrap_segment(whisper_context *ctx,whisper_state *state,int max_len,bool split_on_word)

{
  pointer pwVar1;
  pointer pcVar2;
  char *__s;
  pointer pwVar3;
  int iVar4;
  mapped_type *pmVar5;
  size_t sVar6;
  int iVar7;
  int iVar8;
  size_type __new_size;
  string text;
  value_type segment;
  int local_134;
  undefined1 *local_118;
  char *local_110;
  undefined1 local_108;
  undefined7 uStack_107;
  int64_t local_f8;
  int64_t iStack_f0;
  long *local_e8 [2];
  long local_d8 [2];
  float local_c8;
  vector<whisper_token_data,_std::allocator<whisper_token_data>_> local_c0;
  bool local_a8;
  vector<whisper_segment,_std::allocator<whisper_segment>_> *local_98;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_90;
  whisper_segment local_88;
  
  pwVar1 = (state->result_all).super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_f8 = pwVar1[-1].t0;
  iStack_f0 = pwVar1[-1].t1;
  local_e8[0] = local_d8;
  pcVar2 = pwVar1[-1].text._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e8,pcVar2,pcVar2 + pwVar1[-1].text._M_string_length);
  local_c8 = pwVar1[-1].no_speech_prob;
  std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::vector
            (&local_c0,&pwVar1[-1].tokens);
  local_a8 = pwVar1[-1].speaker_turn_next;
  local_118 = &local_108;
  local_110 = (char *)0x0;
  local_108 = 0;
  if ((int)((ulong)((long)local_c0.
                          super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_c0.
                         super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249 < 1) {
    local_134 = 1;
  }
  else {
    local_98 = &state->result_all;
    local_90 = &(ctx->vocab).id_to_token;
    local_134 = 1;
    iVar8 = 0;
    iVar7 = 0;
    do {
      pwVar3 = local_c0.super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
               _M_impl.super__Vector_impl_data._M_start;
      __new_size = (size_type)iVar7;
      if (local_c0.super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
          _M_impl.super__Vector_impl_data._M_start[__new_size].id < (ctx->vocab).token_eot) {
        local_88.t0 = CONCAT44(local_88.t0._4_4_,
                               local_c0.
                               super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                               ._M_impl.super__Vector_impl_data._M_start[__new_size].id);
        pmVar5 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::at(local_90,(key_type *)&local_88);
        __s = (pmVar5->_M_dataplus)._M_p;
        sVar6 = strlen(__s);
        iVar8 = iVar8 + (int)sVar6;
        if (((iVar7 < 1) || (iVar8 <= max_len)) || ((split_on_word && (*__s != ' ')))) {
          std::__cxx11::string::append((char *)&local_118);
        }
        else {
          std::__cxx11::string::operator=
                    ((string *)
                     &(state->result_all).
                      super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1].text,(string *)&local_118);
          pwVar1 = (state->result_all).
                   super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pwVar1[-1].t1 = pwVar3[__new_size].t0;
          std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::resize
                    (&pwVar1[-1].tokens,__new_size);
          (state->result_all).super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1].speaker_turn_next = false;
          local_88.t0 = 0;
          local_88.t1 = 0;
          local_88.text._M_dataplus._M_p = (pointer)&local_88.text.field_2;
          local_88.text._M_string_length = 0;
          local_88.text.field_2._M_local_buf[0] = '\0';
          local_88.no_speech_prob = 0.0;
          local_88.tokens.
          super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_88.tokens.
          super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
          local_88.speaker_turn_next = false;
          local_88.tokens.
          super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_88.tokens.
          super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          local_88.tokens.
          super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>._M_impl.
          super__Vector_impl_data._M_finish._1_7_ = 0;
          std::vector<whisper_segment,_std::allocator<whisper_segment>_>::
          emplace_back<whisper_segment>(local_98,&local_88);
          if (local_88.tokens.
              super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.tokens.
                            super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            CONCAT71(local_88.tokens.
                                     super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                     local_88.tokens.
                                     super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                            (long)local_88.tokens.
                                  super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88.text._M_dataplus._M_p != &local_88.text.field_2) {
            operator_delete(local_88.text._M_dataplus._M_p,
                            CONCAT71(local_88.text.field_2._M_allocated_capacity._1_7_,
                                     local_88.text.field_2._M_local_buf[0]) + 1);
          }
          pwVar1 = (state->result_all).
                   super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pwVar1[-1].t0 = pwVar3[__new_size].t0;
          pwVar1[-1].t1 = iStack_f0;
          std::vector<whisper_token_data,std::allocator<whisper_token_data>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<whisper_token_data*,std::vector<whisper_token_data,std::allocator<whisper_token_data>>>>
                    ((vector<whisper_token_data,std::allocator<whisper_token_data>> *)
                     &pwVar1[-1].tokens,
                     pwVar1[-1].tokens.
                     super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     local_c0.
                     super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
                     _M_impl.super__Vector_impl_data._M_start + __new_size,
                     local_c0.
                     super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          (state->result_all).super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1].speaker_turn_next = local_a8;
          std::__cxx11::string::_M_replace((ulong)&local_118,0,local_110,0x15c560);
          pwVar1 = (state->result_all).
                   super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          local_f8 = pwVar1[-1].t0;
          iStack_f0 = pwVar1[-1].t1;
          std::__cxx11::string::_M_assign((string *)local_e8);
          local_c8 = pwVar1[-1].no_speech_prob;
          std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator=
                    (&local_c0,&pwVar1[-1].tokens);
          local_a8 = pwVar1[-1].speaker_turn_next;
          local_134 = local_134 + 1;
          iVar8 = 0;
          iVar7 = -1;
        }
      }
      iVar7 = iVar7 + 1;
      iVar4 = (int)((ulong)((long)local_c0.
                                  super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_c0.
                                 super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
    } while (SBORROW4(iVar7,iVar4 * -0x49249249) != iVar7 + iVar4 * 0x49249249 < 0);
  }
  std::__cxx11::string::operator=
            ((string *)
             &(state->result_all).
              super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].text,(string *)&local_118);
  if (local_118 != &local_108) {
    operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
  }
  if (local_c0.super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.
                          super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.
                          super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  return local_134;
}

Assistant:

static int whisper_wrap_segment(struct whisper_context & ctx, struct whisper_state & state, int max_len, bool split_on_word) {
    auto segment = state.result_all.back();

    int res = 1;
    int acc = 0;

    std::string text;

    for (int i = 0; i < (int) segment.tokens.size(); i++) {
        const auto & token = segment.tokens[i];
        if (token.id >= whisper_token_eot(&ctx)) {
            continue;
        }

        const auto txt = whisper_token_to_str(&ctx, token.id);
        const int cur = strlen(txt);

        if (acc + cur > max_len && i > 0 && should_split_on_word(txt, split_on_word)) {
            state.result_all.back().text = std::move(text);
            state.result_all.back().t1 = token.t0;
            state.result_all.back().tokens.resize(i);
            state.result_all.back().speaker_turn_next = false;

            state.result_all.push_back({});
            state.result_all.back().t0 = token.t0;
            state.result_all.back().t1 = segment.t1;

            // add tokens [i, end] to the new segment
            state.result_all.back().tokens.insert(
                state.result_all.back().tokens.end(),
                    segment.tokens.begin() + i,
                    segment.tokens.end());

            state.result_all.back().speaker_turn_next = segment.speaker_turn_next;

            acc = 0;
            text = "";

            segment = state.result_all.back();
            i = -1;

            res++;
        } else {
            acc += cur;
            text += txt;
        }
    }

    state.result_all.back().text = std::move(text);

    return res;
}